

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::split_leaf(memory_tree *b,single_learner *base,uint32_t cn)

{
  undefined8 uVar1;
  uint32_t uVar2;
  long lVar3;
  example *peVar4;
  label_t lVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  uint32_t cn_00;
  node *pnVar9;
  size_t sVar10;
  ostream *this;
  void *this_00;
  uint *puVar11;
  example **ppeVar12;
  double *pdVar13;
  ulong uVar14;
  uint in_EDX;
  long in_RDI;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float leaf_pred_1;
  float leaf_pred;
  float scalar;
  labels preds;
  labels multilabels;
  uint32_t save_multi_pred;
  label_t mc;
  uint32_t ec_pos;
  size_t ec_id;
  uint32_t right_child;
  uint32_t left_child;
  node *in_stack_fffffffffffffdf8;
  v_array<memory_tree_ns::node> *in_stack_fffffffffffffe00;
  example *in_stack_fffffffffffffe08;
  double dVar17;
  learner<char,_example> *in_stack_fffffffffffffe10;
  node *in_stack_fffffffffffffe20;
  example *in_stack_fffffffffffffec0;
  single_learner *in_stack_fffffffffffffec8;
  memory_tree *in_stack_fffffffffffffed0;
  double local_128;
  float local_120;
  float local_11c;
  float local_118;
  uint32_t local_114;
  float fStack_110;
  float local_10c;
  float *local_108;
  float *local_100;
  float *local_f8;
  size_t local_f0;
  label_t local_e8;
  wclass *local_e0;
  wclass *local_d8;
  size_t local_d0;
  float local_c8;
  label_t local_c4;
  uint local_bc;
  ulong local_b8;
  uint local_64;
  uint local_18;
  uint local_14;
  long local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_EDX);
  pnVar9->internal = 1;
  sVar10 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(local_8 + 8));
  local_18 = (uint)sVar10;
  node::node(in_stack_fffffffffffffe20);
  v_array<memory_tree_ns::node>::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  pnVar9->internal = -1;
  lVar3 = *(long *)(local_8 + 0x78);
  *(long *)(local_8 + 0x78) = lVar3 + 1;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  pnVar9->base_router = (uint32_t)lVar3;
  sVar10 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(local_8 + 8));
  local_64 = (uint)sVar10;
  node::node(in_stack_fffffffffffffe20);
  v_array<memory_tree_ns::node>::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
  pnVar9->internal = -1;
  lVar3 = *(long *)(local_8 + 0x78);
  *(long *)(local_8 + 0x78) = lVar3 + 1;
  cn_00 = (uint32_t)lVar3;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
  pnVar9->base_router = cn_00;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  if (*(ulong *)(local_8 + 0x90) < (ulong)(pnVar9->depth + 1)) {
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    *(ulong *)(local_8 + 0x90) = (ulong)(pnVar9->depth + 1);
    this = std::operator<<((ostream *)&std::cout,"depth ");
    this_00 = (void *)std::ostream::operator<<(this,*(ulong *)(local_8 + 0x90));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  uVar8 = local_18;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  uVar7 = local_64;
  pnVar9->left = uVar8;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  uVar8 = local_14;
  pnVar9->right = uVar7;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  uVar7 = local_14;
  pnVar9->parent = uVar8;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
  pnVar9->parent = uVar7;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  uVar2 = pnVar9->depth;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  pnVar9->depth = uVar2 + 1;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  uVar2 = pnVar9->depth;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
  pnVar9->depth = uVar2 + 1;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  if (*(ulong *)(local_8 + 0x90) < (ulong)pnVar9->depth) {
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
    *(ulong *)(local_8 + 0x90) = (ulong)pnVar9->depth;
  }
  local_b8 = 0;
  while( true ) {
    uVar14 = local_b8;
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    sVar10 = v_array<unsigned_int>::size(&pnVar9->examples_index);
    if (sVar10 <= uVar14) break;
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    puVar11 = v_array<unsigned_int>::operator[](&pnVar9->examples_index,local_b8);
    local_bc = *puVar11;
    local_c8 = 0.0;
    if (*(int *)(local_8 + 0xcc) == 0) {
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      local_c4 = ((*ppeVar12)->l).multi;
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      local_c8 = ((*ppeVar12)->pred).scalar;
    }
    else {
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      peVar4 = *ppeVar12;
      local_e8 = (peVar4->l).multi;
      local_e0 = (peVar4->l).cs.costs._end;
      local_d8 = (peVar4->l).cs.costs.end_array;
      local_d0 = (peVar4->l).cs.costs.erase_count;
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      peVar4 = *ppeVar12;
      local_108 = (peVar4->pred).scalars._begin;
      local_100 = (peVar4->pred).scalars._end;
      local_f8 = (peVar4->pred).scalars.end_array;
      local_f0 = (peVar4->pred).scalars.erase_count;
    }
    local_114 = 0x3f800000;
    fStack_110 = 1.0;
    local_10c = 0.0;
    ppeVar12 = v_array<example_*>::operator[]
                         ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
    peVar4 = *ppeVar12;
    lVar5.weight = fStack_110;
    lVar5.label = local_114;
    (peVar4->l).multi = lVar5;
    (peVar4->l).simple.initial = local_10c;
    v_array<example_*>::operator[]((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    LEARNER::learner<char,_example>::predict
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00
              );
    ppeVar12 = v_array<example_*>::operator[]
                         ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
    local_118 = ((*ppeVar12)->pred).scalar;
    if (0.0 <= local_118) {
      v_array<memory_tree_ns::node>::operator[]
                ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)in_stack_fffffffffffffe00,
                 &in_stack_fffffffffffffdf8->parent);
      v_array<example_*>::operator[]((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      local_120 = train_node(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                             in_stack_fffffffffffffec0,cn_00);
      pnVar9 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
      insert_descent(pnVar9,local_120);
    }
    else {
      v_array<memory_tree_ns::node>::operator[]
                ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
      v_array<unsigned_int>::push_back
                ((v_array<unsigned_int> *)in_stack_fffffffffffffe00,
                 &in_stack_fffffffffffffdf8->parent);
      v_array<example_*>::operator[]((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      local_11c = train_node(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                             in_stack_fffffffffffffec0,cn_00);
      pnVar9 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
      insert_descent(pnVar9,local_11c);
    }
    if (*(int *)(local_8 + 0xcc) == 0) {
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      fVar6 = local_c8;
      ((*ppeVar12)->l).multi = local_c4;
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      ((*ppeVar12)->pred).scalar = fVar6;
    }
    else {
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      peVar4 = *ppeVar12;
      (peVar4->pred).scalars._begin = local_108;
      (peVar4->pred).scalars._end = local_100;
      (peVar4->pred).scalars.end_array = local_f8;
      (peVar4->pred).scalars.erase_count = local_f0;
      ppeVar12 = v_array<example_*>::operator[]
                           ((v_array<example_*> *)(local_8 + 0x28),(ulong)local_bc);
      peVar4 = *ppeVar12;
      (peVar4->l).multi = local_e8;
      (peVar4->l).cs.costs._end = local_e0;
      (peVar4->l).cs.costs.end_array = local_d8;
      (peVar4->l).cs.costs.erase_count = local_d0;
    }
    local_b8 = local_b8 + 1;
  }
  v_array<memory_tree_ns::node>::operator[]
            ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_fffffffffffffe00);
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_18);
  sVar10 = v_array<unsigned_int>::size(&pnVar9->examples_index);
  auVar15._8_4_ = (int)(sVar10 >> 0x20);
  auVar15._0_8_ = sVar10;
  auVar15._12_4_ = 0x45300000;
  local_128 = (auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0);
  pdVar13 = std::max<double>(&local_128,(double *)&stack0xfffffffffffffed0);
  dVar17 = *pdVar13;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  pnVar9->nl = dVar17;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_64);
  v_array<unsigned_int>::size(&pnVar9->examples_index);
  pdVar13 = std::max<double>((double *)&stack0xfffffffffffffec8,(double *)&stack0xfffffffffffffec0);
  dVar17 = *pdVar13;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  pnVar9->nr = dVar17;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  pdVar13 = &pnVar9->nl;
  pnVar9 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
  pdVar13 = std::max<double>(pdVar13,&pnVar9->nr);
  uVar1 = *(undefined8 *)(local_8 + 0x98);
  auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = 0x45300000;
  if ((auVar16._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < *pdVar13) {
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    pdVar13 = &pnVar9->nl;
    pnVar9 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)local_14);
    pdVar13 = std::max<double>(pdVar13,&pnVar9->nr);
    uVar14 = (ulong)*pdVar13;
    *(ulong *)(local_8 + 0x98) =
         uVar14 | (long)(*pdVar13 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f;
  }
  return;
}

Assistant:

void split_leaf(memory_tree& b, single_learner& base, const uint32_t cn)
    {
        //create two children
        b.nodes[cn].internal = 1; //swith to internal node.
        uint32_t left_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());
        b.nodes[left_child].internal = -1;  //left leaf
        b.nodes[left_child].base_router = (b.routers_used++);
        uint32_t right_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());  
        b.nodes[right_child].internal = -1;  //right leaf
        b.nodes[right_child].base_router = (b.routers_used++); 

        if (b.nodes[cn].depth + 1 > b.max_depth){
            b.max_depth = b.nodes[cn].depth + 1;
            cout<<"depth "<<b.max_depth<<endl;
        }

        b.nodes[cn].left = left_child;
        b.nodes[cn].right = right_child;
        b.nodes[left_child].parent = cn;
        b.nodes[right_child].parent = cn;
        b.nodes[left_child].depth = b.nodes[cn].depth + 1;
        b.nodes[right_child].depth = b.nodes[cn].depth + 1;

        if (b.nodes[left_child].depth > b.max_depth)
            b.max_depth = b.nodes[left_child].depth;

        //rout the examples stored in the node to the left and right
        for(size_t ec_id = 0; ec_id < b.nodes[cn].examples_index.size(); ec_id++) //scan all examples stored in the cn
        {
            uint32_t ec_pos = b.nodes[cn].examples_index[ec_id];
            MULTICLASS::label_t mc;
            uint32_t save_multi_pred = 0;
            MULTILABEL::labels multilabels;
            MULTILABEL::labels preds;
            if (b.oas == false){
                mc = b.examples[ec_pos]->l.multi;
                save_multi_pred = b.examples[ec_pos]->pred.multiclass;
            }
            else{
                multilabels = b.examples[ec_pos]->l.multilabels;
                preds = b.examples[ec_pos]->pred.multilabels;
            }

            b.examples[ec_pos]->l.simple = {1.f, 1.f, 0.f};
            base.predict(*b.examples[ec_pos], b.nodes[cn].base_router); //re-predict
            float scalar = b.examples[ec_pos]->pred.scalar; //this is spliting the leaf. 
            if (scalar < 0)
            {
                b.nodes[left_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], left_child);
                insert_descent(b.nodes[left_child], leaf_pred); //fake descent, only for update nl and nr                
            }
            else
            {
                b.nodes[right_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], right_child);
                insert_descent(b.nodes[right_child], leaf_pred); //fake descent. for update nr and nl
            }

            if(b.oas == false){
                b.examples[ec_pos]->l.multi = mc;
                b.examples[ec_pos]->pred.multiclass = save_multi_pred;
            }
            else{
                b.examples[ec_pos]->pred.multilabels = preds;
                b.examples[ec_pos]->l.multilabels = multilabels;
            }
        }
        b.nodes[cn].examples_index.delete_v(); //empty the cn's example list
        b.nodes[cn].nl = (std::max)(double(b.nodes[left_child].examples_index.size()), 0.001); //avoid to set nl to zero
        b.nodes[cn].nr = (std::max)(double(b.nodes[right_child].examples_index.size()), 0.001); //avoid to set nr to zero

        if ((std::max)(b.nodes[cn].nl, b.nodes[cn].nr) > b.max_ex_in_leaf)
        {
            b.max_ex_in_leaf = (std::max)(b.nodes[cn].nl, b.nodes[cn].nr);
            //cout<<b.max_ex_in_leaf<<endl;
        }
    }